

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

csubstr __thiscall c4::yml::Parser::_scan_dquot_scalar(Parser *this)

{
  pfn_error p_Var1;
  State *pSVar2;
  ulong ahead;
  code *pcVar3;
  Location LVar4;
  Location LVar5;
  Location LVar6;
  Location LVar7;
  Location LVar8;
  Location LVar9;
  Location LVar10;
  Location LVar11;
  Location LVar12;
  bool bVar13;
  bool bVar14;
  char cVar15;
  bool bVar16;
  ulong uVar17;
  long lVar18;
  char *pcVar19;
  bool bVar20;
  size_t sVar21;
  char *pcVar22;
  ulong uVar23;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  byte bVar28;
  csubstr cVar29;
  basic_substring<char> bVar30;
  csubstr cVar31;
  basic_substring<char> local_1f8;
  char msg [41];
  char *pcStack_180;
  size_t local_178;
  char *pcStack_158;
  size_t local_150;
  char *pcStack_130;
  size_t local_128;
  char *pcStack_108;
  size_t local_100;
  char *pcStack_e0;
  size_t local_d8;
  char *pcStack_b8;
  size_t local_b0;
  char *pcStack_90;
  size_t local_88;
  char *pcStack_68;
  size_t local_60;
  char *pcStack_40;
  size_t local_38;
  ulong uVar24;
  
  bVar28 = 0;
  uVar26 = (this->m_state->pos).super_LineCol.offset;
  uVar27 = (this->m_buf).len;
  if (uVar27 < uVar26) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
      pcVar3 = (code *)swi(3);
      cVar29 = (csubstr)(*pcVar3)();
      return cVar29;
    }
    handle_error(0x1e5106,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x1533,"first >= 0 && first <= len");
  }
  basic_substring<char>::basic_substring
            ((basic_substring<char> *)msg,(this->m_buf).str + uVar26,uVar27 - uVar26);
  local_1f8.len._0_1_ = msg[8];
  local_1f8.len._1_1_ = msg[9];
  local_1f8.len._2_1_ = msg[10];
  local_1f8.len._3_1_ = msg[0xb];
  local_1f8.len._4_1_ = msg[0xc];
  local_1f8.len._5_1_ = msg[0xd];
  local_1f8.len._6_1_ = msg[0xe];
  local_1f8.len._7_1_ = msg[0xf];
  local_1f8.str = (char *)msg._0_8_;
  if (msg._8_8_ == 0) {
    sVar21 = (this->m_state->pos).super_LineCol.offset;
  }
  else {
    cVar15 = *(char *)msg._0_8_;
    if (cVar15 == ' ') {
      local_1f8 = basic_substring<char>::triml(&local_1f8,' ');
      uVar27 = (this->m_buf).len;
      if (uVar27 < uVar26) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
          pcVar3 = (code *)swi(3);
          cVar29 = (csubstr)(*pcVar3)();
          return cVar29;
        }
        handle_error(0x1e5106,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x1533,"first >= 0 && first <= len");
      }
      basic_substring<char>::basic_substring
                ((basic_substring<char> *)msg,(this->m_buf).str + uVar26,uVar27 - uVar26);
      if (msg._8_8_ == 0) {
        if ((local_1f8.len != 0) ||
           (pcVar19 = (char *)msg._0_8_, msg._0_8_ == 0 || (char *)msg._0_8_ != local_1f8.str))
        goto LAB_001ccd38;
      }
      else {
        pcVar19 = local_1f8.str;
        if (local_1f8.str < (ulong)msg._0_8_ ||
            (char *)(msg._8_8_ + msg._0_8_) < local_1f8.str + local_1f8.len) {
LAB_001ccd38:
          builtin_strncpy(msg + 0x10,"_buf.sub(b).is_super(s))",0x19);
          builtin_strncpy(msg,"check failed: (m",0x10);
          if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
            pcVar3 = (code *)swi(3);
            cVar29 = (csubstr)(*pcVar3)();
            return cVar29;
          }
          p_Var1 = (this->m_stack).m_callbacks.m_error;
          cVar29 = to_csubstr(
                             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                             );
          local_38 = cVar29.len;
          pcStack_40 = cVar29.str;
          LVar4.super_LineCol.col = 0;
          LVar4.super_LineCol.offset = SUB168(ZEXT816(0x7a7c) << 0x40,0);
          LVar4.super_LineCol.line = SUB168(ZEXT816(0x7a7c) << 0x40,8);
          LVar4.name.str = pcStack_40;
          LVar4.name.len = local_38;
          (*p_Var1)(msg,0x29,LVar4,(this->m_stack).m_callbacks.m_user_data);
          pcVar19 = local_1f8.str;
        }
      }
      uVar27 = (this->m_buf).len;
      if (uVar27 < uVar26) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
          pcVar3 = (code *)swi(3);
          cVar29 = (csubstr)(*pcVar3)();
          return cVar29;
        }
        handle_error(0x1e5106,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x1533,"first >= 0 && first <= len");
      }
      basic_substring<char>::basic_substring
                ((basic_substring<char> *)msg,(this->m_buf).str + uVar26,uVar27 - uVar26);
      if (pcVar19 < (ulong)msg._0_8_) {
        builtin_strncpy(msg + 0x10,".begin() >= m_buf.sub(b).",0x19);
        builtin_strncpy(msg,"check failed: (s",0x10);
        if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
          pcVar3 = (code *)swi(3);
          cVar29 = (csubstr)(*pcVar3)();
          return cVar29;
        }
        p_Var1 = (this->m_stack).m_callbacks.m_error;
        cVar29 = to_csubstr(
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           );
        local_60 = cVar29.len;
        pcStack_68 = cVar29.str;
        LVar5.super_LineCol.col = 0;
        LVar5.super_LineCol.offset = SUB168(ZEXT816(0x7a7d) << 0x40,0);
        LVar5.super_LineCol.line = SUB168(ZEXT816(0x7a7d) << 0x40,8);
        LVar5.name.str = pcStack_68;
        LVar5.name.len = local_60;
        (*p_Var1)(msg,0x32,LVar5,(this->m_stack).m_callbacks.m_user_data);
      }
      pcVar19 = local_1f8.str;
      uVar27 = (this->m_buf).len;
      if (uVar27 < uVar26) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
          pcVar3 = (code *)swi(3);
          cVar29 = (csubstr)(*pcVar3)();
          return cVar29;
        }
        handle_error(0x1e5106,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x1533,"first >= 0 && first <= len");
      }
      basic_substring<char>::basic_substring
                ((basic_substring<char> *)msg,(this->m_buf).str + uVar26,uVar27 - uVar26);
      _line_progressed(this,(long)pcVar19 - msg._0_8_);
      sVar21 = (this->m_state->pos).super_LineCol.offset;
      if (local_1f8.len == 0) goto LAB_001ccf42;
      cVar15 = *local_1f8.str;
    }
    else {
      sVar21 = (this->m_state->pos).super_LineCol.offset;
    }
    if (cVar15 == '\"') goto LAB_001ccfee;
  }
LAB_001ccf42:
  builtin_strncpy(msg,"check failed: (s.begins_with(\'\"\'))",0x23);
  if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
    pcVar3 = (code *)swi(3);
    cVar29 = (csubstr)(*pcVar3)();
    return cVar29;
  }
  p_Var1 = (this->m_stack).m_callbacks.m_error;
  cVar29 = to_csubstr(
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     );
  local_88 = cVar29.len;
  pcStack_90 = cVar29.str;
  LVar6.super_LineCol.col = 0;
  LVar6.super_LineCol.offset = SUB168(ZEXT816(0x7a81) << 0x40,0);
  LVar6.super_LineCol.line = SUB168(ZEXT816(0x7a81) << 0x40,8);
  LVar6.name.str = pcStack_90;
  LVar6.name.len = local_88;
  (*p_Var1)(msg,0x23,LVar6,(this->m_stack).m_callbacks.m_user_data);
LAB_001ccfee:
  uVar26 = 1;
  _line_progressed(this,1);
  if (local_1f8.len == 0) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
      pcVar3 = (code *)swi(3);
      cVar29 = (csubstr)(*pcVar3)();
      return cVar29;
    }
    handle_error(0x1e5106,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x1533,"first >= 0 && first <= len");
  }
  basic_substring<char>::basic_substring
            ((basic_substring<char> *)msg,local_1f8.str + 1,local_1f8.len - 1);
  local_1f8.len._0_1_ = msg[8];
  local_1f8.len._1_1_ = msg[9];
  local_1f8.len._2_1_ = msg[10];
  local_1f8.len._3_1_ = msg[0xb];
  local_1f8.len._4_1_ = msg[0xc];
  local_1f8.len._5_1_ = msg[0xd];
  local_1f8.len._6_1_ = msg[0xe];
  local_1f8.len._7_1_ = msg[0xf];
  local_1f8.str = (char *)msg._0_8_;
  bVar14 = false;
  do {
    pSVar2 = this->m_state;
    uVar27 = (pSVar2->pos).super_LineCol.offset;
    uVar17 = (this->m_buf).len;
    if (uVar17 <= uVar27) {
LAB_001cd2e1:
      bVar16 = is_debugger_attached();
      if ((bVar16) && (bVar16 = is_debugger_attached(), bVar16)) {
        pcVar3 = (code *)swi(3);
        cVar29 = (csubstr)(*pcVar3)();
        return cVar29;
      }
      cVar29.len = 0x34;
      cVar29.str = "ERROR: reached end of file looking for closing quote";
      _err<>(this,cVar29);
LAB_001cd5a8:
      cVar29 = (csubstr)local_1f8;
      if (bVar14) {
        cVar29 = _filter_dquot_scalar(this,local_1f8);
        if ((((local_1f8.len < cVar29.len) && (local_1f8.len != 0)) &&
            (local_1f8.str != (char *)0x0)) &&
           (bVar30 = basic_substring<char>::trim(&local_1f8,' '),
           bVar30.str != (char *)0x0 && bVar30.len != 0)) {
          pcVar19 = "check failed: (ret.len <= s.len || s.empty() || s.trim(\' \').empty())";
          pcVar22 = msg;
          for (lVar25 = 0x45; lVar25 != 0; lVar25 = lVar25 + -1) {
            *pcVar22 = *pcVar19;
            pcVar19 = pcVar19 + (ulong)bVar28 * -2 + 1;
            pcVar22 = pcVar22 + (ulong)bVar28 * -2 + 1;
          }
          if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
            pcVar3 = (code *)swi(3);
            cVar29 = (csubstr)(*pcVar3)();
            return cVar29;
          }
          p_Var1 = (this->m_stack).m_callbacks.m_error;
          cVar31 = to_csubstr(
                             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                             );
          local_178 = cVar31.len;
          pcStack_180 = cVar31.str;
          LVar12.super_LineCol.col = 0;
          LVar12.super_LineCol.offset = SUB168(ZEXT816(0x7acc) << 0x40,0);
          LVar12.super_LineCol.line = SUB168(ZEXT816(0x7acc) << 0x40,8);
          LVar12.name.str = pcStack_180;
          LVar12.name.len = local_178;
          (*p_Var1)(msg,0x45,LVar12,(this->m_stack).m_callbacks.m_user_data);
        }
      }
      return cVar29;
    }
    pcVar19 = (pSVar2->line_contents).rem.str;
    ahead = (pSVar2->line_contents).rem.len;
    bVar16 = true;
    uVar23 = 0;
    while (uVar24 = 0xffffffffffffffff, uVar23 < ahead) {
      cVar15 = pcVar19[uVar23];
      bVar16 = (bool)(cVar15 == ' ' & bVar16);
      if (cVar15 == '\\') {
        uVar24 = uVar23 + 1;
        bVar14 = true;
        if ((ahead <= uVar24) || ((pcVar19[uVar24] != '\\' && (pcVar19[uVar24] != '\"'))))
        goto LAB_001cd0a4;
      }
      else {
        uVar24 = uVar23;
        if (cVar15 == '\"') break;
LAB_001cd0a4:
        uVar24 = uVar23;
      }
      uVar23 = uVar24 + 1;
    }
    bVar20 = true;
    bVar13 = !bVar14;
    bVar14 = bVar20;
    if (((bVar13) && (uVar26 < 2)) && (!bVar16)) {
      bVar14 = false;
      if ((ahead != 0) && (bVar14 = false, pcVar19 == (pSVar2->line_contents).full.str)) {
        bVar14 = *pcVar19 == ' ';
      }
    }
    if (uVar24 != 0xffffffffffffffff) {
      if (uVar17 <= uVar24) {
        builtin_strncpy(msg + 0x10,"os >= 0 && pos < m_buf.le",0x19);
        builtin_strncpy(msg,"check failed: (p",0x10);
        if ((((byte)s_error_flags & 1) != 0) && (bVar16 = is_debugger_attached(), bVar16)) {
          pcVar3 = (code *)swi(3);
          cVar29 = (csubstr)(*pcVar3)();
          return cVar29;
        }
        p_Var1 = (this->m_stack).m_callbacks.m_error;
        cVar29 = to_csubstr(
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           );
        local_b0 = cVar29.len;
        pcStack_b8 = cVar29.str;
        LVar7.super_LineCol.col = 0;
        LVar7.super_LineCol.offset = SUB168(ZEXT816(0x7ab1) << 0x40,0);
        LVar7.super_LineCol.line = SUB168(ZEXT816(0x7ab1) << 0x40,8);
        LVar7.name.str = pcStack_b8;
        LVar7.name.len = local_b0;
        (*p_Var1)(msg,0x2c,LVar7,(this->m_stack).m_callbacks.m_user_data);
        uVar27 = (this->m_state->pos).super_LineCol.offset;
        uVar17 = (this->m_buf).len;
      }
      if (uVar17 <= uVar27 + uVar24) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
          pcVar3 = (code *)swi(3);
          cVar29 = (csubstr)(*pcVar3)();
          return cVar29;
        }
        handle_error(0x1e5106,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x14c3,"i >= 0 && i < len");
      }
      if ((this->m_buf).str[uVar27 + uVar24] != '\"') {
        builtin_strncpy(msg + 0x10,"_buf[m_state->pos.offset ",0x19);
        builtin_strncpy(msg,"check failed: (m",0x10);
        if ((((byte)s_error_flags & 1) != 0) && (bVar16 = is_debugger_attached(), bVar16)) {
          pcVar3 = (code *)swi(3);
          cVar29 = (csubstr)(*pcVar3)();
          return cVar29;
        }
        p_Var1 = (this->m_stack).m_callbacks.m_error;
        cVar29 = to_csubstr(
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           );
        local_d8 = cVar29.len;
        pcStack_e0 = cVar29.str;
        LVar8.super_LineCol.col = 0;
        LVar8.super_LineCol.offset = SUB168(ZEXT816(0x7ab2) << 0x40,0);
        LVar8.super_LineCol.line = SUB168(ZEXT816(0x7ab2) << 0x40,8);
        LVar8.name.str = pcStack_e0;
        LVar8.name.len = local_d8;
        (*p_Var1)(msg,0x38,LVar8,(this->m_stack).m_callbacks.m_user_data);
      }
      _line_progressed(this,uVar24 + 1);
      lVar25 = ~sVar21 + (this->m_state->pos).super_LineCol.offset;
      if (lVar25 == 0) {
        builtin_strncpy(msg,"check failed: (pos > 0)",0x18);
        if ((((byte)s_error_flags & 1) != 0) && (bVar16 = is_debugger_attached(), bVar16)) {
          pcVar3 = (code *)swi(3);
          cVar29 = (csubstr)(*pcVar3)();
          return cVar29;
        }
        p_Var1 = (this->m_stack).m_callbacks.m_error;
        cVar29 = to_csubstr(
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           );
        local_100 = cVar29.len;
        pcStack_108 = cVar29.str;
        LVar9.super_LineCol.col = 0;
        LVar9.super_LineCol.offset = SUB168(ZEXT816(0x7ac2) << 0x40,0);
        LVar9.super_LineCol.line = SUB168(ZEXT816(0x7ac2) << 0x40,8);
        LVar9.name.str = pcStack_108;
        LVar9.name.len = local_100;
        (*p_Var1)(msg,0x18,LVar9,(this->m_stack).m_callbacks.m_user_data);
      }
      else if (lVar25 == -1) goto LAB_001cd2e1;
      pcVar19 = (this->m_buf).str;
      sVar21 = (this->m_buf).len;
      if ((local_1f8.str + local_1f8.len != pcVar19 + sVar21) &&
         (local_1f8.str[local_1f8.len] != '\"')) {
        builtin_strncpy(msg + 0x10,".end() == m_buf.end() || ",0x19);
        builtin_strncpy(msg,"check failed: (s",0x10);
        if ((((byte)s_error_flags & 1) != 0) && (bVar16 = is_debugger_attached(), bVar16)) {
          pcVar3 = (code *)swi(3);
          cVar29 = (csubstr)(*pcVar3)();
          return cVar29;
        }
        p_Var1 = (this->m_stack).m_callbacks.m_error;
        cVar29 = to_csubstr(
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           );
        local_128 = cVar29.len;
        pcStack_130 = cVar29.str;
        LVar10.super_LineCol.col = 0;
        LVar10.super_LineCol.offset = SUB168(ZEXT816(0x7ac3) << 0x40,0);
        LVar10.super_LineCol.line = SUB168(ZEXT816(0x7ac3) << 0x40,8);
        LVar10.name.str = pcStack_130;
        LVar10.name.len = local_128;
        (*p_Var1)(msg,0x3a,LVar10,(this->m_stack).m_callbacks.m_user_data);
        pcVar19 = (this->m_buf).str;
        sVar21 = (this->m_buf).len;
      }
      if ((local_1f8.str + local_1f8.len < pcVar19) ||
         (uVar26 = local_1f8.len, pcVar19 + sVar21 < local_1f8.str + local_1f8.len)) {
        pcVar19 = "check failed: (s.end() >= m_buf.begin() && s.end() <= m_buf.end())";
        pcVar22 = msg;
        for (lVar18 = 0x43; lVar18 != 0; lVar18 = lVar18 + -1) {
          *pcVar22 = *pcVar19;
          pcVar19 = pcVar19 + (ulong)bVar28 * -2 + 1;
          pcVar22 = pcVar22 + (ulong)bVar28 * -2 + 1;
        }
        if ((((byte)s_error_flags & 1) != 0) && (bVar16 = is_debugger_attached(), bVar16)) {
          pcVar3 = (code *)swi(3);
          cVar29 = (csubstr)(*pcVar3)();
          return cVar29;
        }
        p_Var1 = (this->m_stack).m_callbacks.m_error;
        cVar29 = to_csubstr(
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           );
        local_150 = cVar29.len;
        pcStack_158 = cVar29.str;
        LVar11.super_LineCol.col = 0;
        LVar11.super_LineCol.offset = SUB168(ZEXT816(0x7ac4) << 0x40,0);
        LVar11.super_LineCol.line = SUB168(ZEXT816(0x7ac4) << 0x40,8);
        LVar11.name.str = pcStack_158;
        LVar11.name.len = local_150;
        (*p_Var1)(msg,0x43,LVar11,(this->m_stack).m_callbacks.m_user_data);
        uVar26 = local_1f8.len;
      }
      uVar27 = lVar25 - 1;
      if ((lVar25 != 0) && (uVar26 < uVar27)) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
          pcVar3 = (code *)swi(3);
          cVar29 = (csubstr)(*pcVar3)();
          return cVar29;
        }
        handle_error(0x1e5106,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x153b,"(num >= 0 && num <= len) || (num == npos)");
      }
      uVar17 = uVar27;
      if (lVar25 == 0) {
        uVar17 = uVar26;
      }
      if ((uVar27 != 0) && (uVar26 < uVar17)) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
          pcVar3 = (code *)swi(3);
          cVar29 = (csubstr)(*pcVar3)();
          return cVar29;
        }
        handle_error(0x1e5106,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x153d,"(first >= 0 && first + rnum <= len) || (num == 0)");
      }
      basic_substring<char>::basic_substring((basic_substring<char> *)msg,local_1f8.str,uVar17);
      local_1f8.len._0_1_ = msg[8];
      local_1f8.len._1_1_ = msg[9];
      local_1f8.len._2_1_ = msg[10];
      local_1f8.len._3_1_ = msg[0xb];
      local_1f8.len._4_1_ = msg[0xc];
      local_1f8.len._5_1_ = msg[0xd];
      local_1f8.len._6_1_ = msg[0xe];
      local_1f8.len._7_1_ = msg[0xf];
      local_1f8.str = (char *)msg._0_8_;
      goto LAB_001cd5a8;
    }
    _line_progressed(this,ahead);
    uVar26 = uVar26 + 1;
    _line_ended(this);
    _scan_line(this);
  } while( true );
}

Assistant:

csubstr Parser::_scan_dquot_scalar()
{
    // quoted scalars can spread over multiple lines!
    // nice explanation here: http://yaml-multiline.info/

    // a span to the end of the file
    size_t b = m_state->pos.offset;
    substr s = m_buf.sub(b);
    if(s.begins_with(' '))
    {
        s = s.triml(' ');
        _RYML_CB_ASSERT(m_stack.m_callbacks, m_buf.sub(b).is_super(s));
        _RYML_CB_ASSERT(m_stack.m_callbacks, s.begin() >= m_buf.sub(b).begin());
        _line_progressed((size_t)(s.begin() - m_buf.sub(b).begin()));
    }
    b = m_state->pos.offset; // take this into account
    _RYML_CB_ASSERT(m_stack.m_callbacks, s.begins_with('"'));

    // skip the opening quote
    _line_progressed(1);
    s = s.sub(1);

    bool needs_filter = false;

    size_t numlines = 1; // we already have one line
    size_t pos = npos; // find the pos of the matching quote
    while( ! _finished_file())
    {
        const csubstr line = m_state->line_contents.rem;
        bool line_is_blank = true;
        _c4dbgpf("scanning double quoted scalar @ line[{}]:  line='{}'", m_state->pos.line, line);
        for(size_t i = 0; i < line.len; ++i)
        {
            const char curr = line.str[i];
            if(curr != ' ')
                line_is_blank = false;
            // every \ is an escape
            if(curr == '\\')
            {
                const char next = i+1 < line.len ? line.str[i+1] : '~';
                needs_filter = true;
                if(next == '"' || next == '\\')
                    ++i;
            }
            else if(curr == '"')
            {
                pos = i;
                break;
            }
        }

        // leading whitespace also needs filtering
        needs_filter = needs_filter
            || (numlines > 1)
            || line_is_blank
            || (_at_line_begin() && line.begins_with(' '));

        if(pos == npos)
        {
            _line_progressed(line.len);
            ++numlines;
        }
        else
        {
            _RYML_CB_ASSERT(m_stack.m_callbacks, pos >= 0 && pos < m_buf.len);
            _RYML_CB_ASSERT(m_stack.m_callbacks, m_buf[m_state->pos.offset + pos] == '"');
            _line_progressed(pos + 1); // progress beyond the quote
            pos = m_state->pos.offset - b - 1; // but we stop before it
            break;
        }

        _line_ended();
        _scan_line();
    }

    if(pos == npos)
    {
        _c4err("reached end of file looking for closing quote");
    }
    else
    {
        _RYML_CB_ASSERT(m_stack.m_callbacks, pos > 0);
        _RYML_CB_ASSERT(m_stack.m_callbacks, s.end() == m_buf.end() || *s.end() == '"');
        _RYML_CB_ASSERT(m_stack.m_callbacks, s.end() >= m_buf.begin() && s.end() <= m_buf.end());
        s = s.sub(0, pos-1);
    }

    if(needs_filter)
    {
        csubstr ret = _filter_dquot_scalar(s);
        _c4dbgpf("final scalar: [{}]\"{}\"", ret.len, ret);
        _RYML_CB_ASSERT(m_stack.m_callbacks, ret.len <= s.len || s.empty() || s.trim(' ').empty());
        return ret;
    }

    _c4dbgpf("final scalar: \"{}\"", s);

    return s;
}